

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat64x2OperationX86X64.cpp
# Opt level: O3

SIMDValue Js::SIMDFloat64x2Operation::OpFromFloat32x4(SIMDValue *value)

{
  SIMDValue SVar1;
  
  SVar1.field_0.f64[1] = (double)(float)((ulong)*(undefined8 *)&value->field_0 >> 0x20);
  SVar1.field_0.f64[0] = (double)(float)*(undefined8 *)&value->field_0;
  return (SIMDValue)SVar1.field_0;
}

Assistant:

SIMDValue SIMDFloat64x2Operation::OpFromFloat32x4(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the lower 2 single-precision, floating-point values
        // to two double-precision, floating-point values
        x86Result.m128d_value = _mm_cvtps_pd(v.m128_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }